

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

void Handler_weaponslot_ISsssssssssssssssssssssssssssssssssssssssssss_PlayerPawn
               (APlayerPawn *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  bool bVar1;
  FString *this;
  char *pcVar2;
  char *str;
  int i;
  FString weapons;
  int slot;
  FPropParam *params_local;
  Baggage *bag_local;
  PClassActor *info_local;
  APlayerPawn *defaults_local;
  
  weapons.Chars._4_4_ = params[1].i;
  bVar1 = DObject::IsKindOf((DObject *)info,PClassPlayerPawn::RegistrationInfo.MyClass);
  if (!bVar1) {
    __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                  ,0xb93,
                  "void Handler_weaponslot_ISsssssssssssssssssssssssssssssssssssssssssss_PlayerPawn(APlayerPawn *, PClassActor *, Baggage &, FPropParam *)"
                 );
  }
  if ((weapons.Chars._4_4_ < 0) || (9 < weapons.Chars._4_4_)) {
    I_Error("Slot must be between 0 and 9.");
  }
  else {
    FString::FString((FString *)&stack0xffffffffffffffc8);
    for (str._4_4_ = 1; str._4_4_ < params->i; str._4_4_ = str._4_4_ + 1) {
      pcVar2 = params[(long)str._4_4_ + 1].s;
      this = FString::operator<<((FString *)&stack0xffffffffffffffc8,' ');
      FString::operator<<(this,pcVar2);
    }
    pcVar2 = FString::operator[]((FString *)&stack0xffffffffffffffc8,1);
    FString::operator=((FString *)
                       ((long)&info[1].super_PClass.super_PNativeStruct.super_PStruct.
                               super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase +
                       (long)weapons.Chars._4_4_ * 8 + 0x20),pcVar2);
    FString::~FString((FString *)&stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(player, weaponslot, ISsssssssssssssssssssssssssssssssssssssssssss, PlayerPawn)
{
	PROP_INT_PARM(slot, 0);

	assert(info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
	if (slot < 0 || slot > 9)
	{
		I_Error("Slot must be between 0 and 9.");
	}
	else
	{
		FString weapons;

		for(int i = 1; i < PROP_PARM_COUNT; ++i)
		{
			PROP_STRING_PARM(str, i);
			weapons << ' ' << str;
		}
		static_cast<PClassPlayerPawn *>(info)->Slot[slot] = &weapons[1];
	}
}